

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint uVar1;
  element_type *peVar2;
  OptionAdder *pOVar3;
  ulong uVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_15a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1248;
  const_iterator local_1240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1238;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1230;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1228;
  const_iterator local_1220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1218;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1210;
  path local_1208;
  path local_11e0;
  undefined1 local_11b8 [8];
  mdsplitter m;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10d5;
  undefined1 local_10d4;
  allocator<char> local_10d3;
  allocator<char> local_10d2;
  allocator<char> local_10d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  string local_10a8 [32];
  string local_1088 [32];
  iterator local_1068;
  size_type local_1060;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1058;
  string local_1040;
  allocator<char> local_1019;
  string local_1018;
  byte local_ff3;
  byte local_ff2;
  allocator<char> local_ff1;
  string local_ff0;
  undefined1 local_fd0 [8];
  ParseResult result;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0 [32];
  shared_ptr<cxxopts::Value> local_ec0;
  shared_ptr<cxxopts::Value> local_eb0;
  shared_ptr<const_cxxopts::Value> local_ea0;
  allocator<char> local_e89;
  string local_e88;
  allocator<char> local_e61;
  string local_e60;
  allocator<char> local_e39;
  string local_e38;
  allocator<char> local_e11;
  string local_e10 [32];
  shared_ptr<cxxopts::Value> local_df0;
  shared_ptr<cxxopts::Value> local_de0;
  shared_ptr<const_cxxopts::Value> local_dd0;
  allocator<char> local_db9;
  string local_db8;
  allocator<char> local_d91;
  string local_d90;
  allocator<char> local_d69;
  string local_d68;
  OptionAdder local_d48;
  bool local_d1b;
  bool local_d1a;
  allocator<char> local_d19;
  undefined1 local_d18 [5];
  bool show_version;
  bool show_help;
  allocator<char> local_cf1;
  string local_cf0 [32];
  shared_ptr<cxxopts::Value> local_cd0;
  shared_ptr<cxxopts::Value> local_cc0;
  shared_ptr<const_cxxopts::Value> local_cb0;
  allocator<char> local_c99;
  string local_c98;
  allocator<char> local_c71;
  string local_c70;
  allocator<char> local_c49;
  string local_c48;
  allocator<char> local_c21;
  string local_c20 [32];
  shared_ptr<cxxopts::Value> local_c00;
  shared_ptr<cxxopts::Value> local_bf0;
  shared_ptr<const_cxxopts::Value> local_be0;
  allocator<char> local_bc9;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50 [32];
  shared_ptr<cxxopts::Value> local_b30;
  shared_ptr<cxxopts::Value> local_b20;
  shared_ptr<const_cxxopts::Value> local_b10;
  allocator<char> local_af9;
  string local_af8;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  allocator<char> local_a81;
  string local_a80 [32];
  shared_ptr<cxxopts::Value> local_a60;
  shared_ptr<cxxopts::Value> local_a50;
  shared_ptr<const_cxxopts::Value> local_a40;
  allocator<char> local_a29;
  string local_a28;
  allocator<char> local_a01;
  string local_a00;
  allocator<char> local_9d9;
  string local_9d8;
  allocator<char> local_9b1;
  string local_9b0 [32];
  shared_ptr<cxxopts::Value> local_990;
  shared_ptr<cxxopts::Value> local_980;
  shared_ptr<const_cxxopts::Value> local_970;
  allocator<char> local_959;
  string local_958;
  allocator<char> local_931;
  string local_930;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0 [32];
  shared_ptr<cxxopts::Value> local_8c0;
  shared_ptr<cxxopts::Value> local_8b0;
  shared_ptr<const_cxxopts::Value> local_8a0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810 [32];
  shared_ptr<cxxopts::Value> local_7f0;
  shared_ptr<cxxopts::Value> local_7e0;
  shared_ptr<const_cxxopts::Value> local_7d0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740 [32];
  shared_ptr<cxxopts::Value> local_720;
  shared_ptr<cxxopts::Value> local_710;
  shared_ptr<const_cxxopts::Value> local_700;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670 [32];
  shared_ptr<cxxopts::Value> local_650;
  shared_ptr<cxxopts::Value> local_640;
  shared_ptr<const_cxxopts::Value> local_630;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0 [32];
  shared_ptr<cxxopts::Value> local_580;
  shared_ptr<cxxopts::Value> local_570;
  shared_ptr<const_cxxopts::Value> local_560;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  OptionAdder local_4d8;
  bool local_4b0;
  bool local_4af;
  bool local_4ae;
  bool local_4ad;
  bool local_4ac;
  bool local_4ab;
  bool local_4aa;
  bool local_4a9;
  bool erase_old_mdsplit_files;
  bool trace;
  bool remove_autotoc;
  bool update_links;
  bool add_front_matter;
  bool indent_headers;
  bool jekyll_escape;
  bool include_toc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clear_html_tags;
  undefined1 local_488 [4];
  short max_split_level;
  shared_ptr<cxxopts::Value> local_468;
  shared_ptr<const_cxxopts::Value> local_458;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8 [32];
  shared_ptr<cxxopts::Value> local_3a8;
  shared_ptr<cxxopts::Value> local_398;
  shared_ptr<const_cxxopts::Value> local_388;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8 [32];
  shared_ptr<cxxopts::Value> local_2d8;
  shared_ptr<cxxopts::Value> local_2c8;
  shared_ptr<const_cxxopts::Value> local_2b8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  OptionAdder local_230;
  undefined1 local_208 [8];
  string repository;
  undefined1 local_1e0 [8];
  string output;
  undefined1 local_1b8 [8];
  string input;
  string local_190;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  Options options;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mdsplit",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"Generate documentation from README.md files",
             (allocator<char> *)(input.field_2._M_local_buf + 0xf));
  cxxopts::Options::Options((Options *)local_138,&local_158,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"README.md",(allocator<char> *)(output.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e0,"docs",(allocator<char> *)(repository.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(repository.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"File",&local_251);
  cxxopts::Options::add_options(&local_230,(Options *)local_138,&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"i,input",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Input file",&local_2a1);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_2d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"README.md",&local_2f9);
  (*peVar2->_vptr_Value[10])(&local_2c8,peVar2,local_2f8);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_2b8,&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"",&local_321);
  pOVar3 = cxxopts::OptionAdder::operator()(&local_230,&local_278,&local_2a0,&local_2b8,&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"o,output",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"Output directory",&local_371);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_3a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_3a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c8,"docs",&local_3c9);
  (*peVar2->_vptr_Value[10])(&local_398,peVar2,local_3c8);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_388,&local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"",&local_3f1);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_348,&local_370,&local_388,&local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"r,repository",&local_419)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Output repository",&local_441);
  cxxopts::value<std::__cxx11::string>
            ((cxxopts *)&local_468,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_458,&local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_488,"",
             (allocator<char> *)
             ((long)&clear_html_tags.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::OptionAdder::operator()(pOVar3,&local_418,&local_440,&local_458,(string *)local_488);
  std::__cxx11::string::~string((string *)local_488);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&clear_html_tags.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_458);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_468);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_388);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_398);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_3a8);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_2b8);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_2c8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  cxxopts::OptionAdder::~OptionAdder(&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  clear_html_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 6;
  _erase_old_mdsplit_files = (pointer)0x0;
  clear_html_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clear_html_tags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&erase_old_mdsplit_files);
  local_4a9 = false;
  local_4aa = true;
  local_4ab = true;
  local_4ac = true;
  local_4ad = true;
  local_4ae = true;
  local_4af = true;
  local_4b0 = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"Behaviour",&local_4f9);
  cxxopts::Options::add_options(&local_4d8,(Options *)local_138,&local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"l,level",&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"Max level for which we should split the file",&local_549);
  cxxopts::value<short>
            ((cxxopts *)&local_580,
             (short *)((long)&clear_html_tags.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"6",&local_5a1);
  (*peVar2->_vptr_Value[10])(&local_570,peVar2,local_5a0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_560,&local_570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"",&local_5c9);
  pOVar3 = cxxopts::OptionAdder::operator()(&local_4d8,&local_520,&local_548,&local_560,&local_5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f0,"c,clear-html",&local_5f1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"List of HTML tags mdsplit should clear",&local_619);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((cxxopts *)&local_650,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&erase_old_mdsplit_files);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_650);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_670,"details,summary",&local_671);
  (*peVar2->_vptr_Value[10])(&local_640,peVar2,local_670);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_630,&local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"",&local_699);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_5f0,&local_618,&local_630,&local_698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"t,toc",&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"Create a table of contents for the new files",&local_6e9);
  cxxopts::value<bool>((cxxopts *)&local_720,&local_4a9);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_720);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_740,"false",&local_741);
  (*peVar2->_vptr_Value[10])(&local_710,peVar2,local_740);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_700,&local_710);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"",&local_769);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_6c0,&local_6e8,&local_700,&local_768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,"e,erase-old-mdsplit-files",&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"Erase old md files also generated with mdsplit",&local_7b9);
  cxxopts::value<bool>((cxxopts *)&local_7f0,&local_4b0);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_810,"true",&local_811);
  (*peVar2->_vptr_Value[10])(&local_7e0,peVar2,local_810);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_7d0,&local_7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"",&local_839);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_790,&local_7b8,&local_7d0,&local_838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"j,jekyll-escape",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"Escape consecutive \"{{\"s for Jekyll processing",&local_889);
  cxxopts::value<bool>((cxxopts *)&local_8c0,&local_4aa);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"true",&local_8e1);
  (*peVar2->_vptr_Value[10])(&local_8b0,peVar2,local_8e0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_8a0,&local_8b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"",&local_909);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_860,&local_888,&local_8a0,&local_908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_930,"header-reindent",&local_931);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"Reindent headers to match the new files",&local_959);
  cxxopts::value<bool>((cxxopts *)&local_990,&local_4ab);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9b0,"true",&local_9b1);
  (*peVar2->_vptr_Value[10])(&local_980,peVar2,local_9b0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_970,&local_980);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d8,"",&local_9d9);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_930,&local_958,&local_970,&local_9d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a00,"f,front-matter",&local_a01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a28,"Include a front-matter in the new files",&local_a29);
  cxxopts::value<bool>((cxxopts *)&local_a60,&local_4ac);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_a60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a80,"true",&local_a81);
  (*peVar2->_vptr_Value[10])(&local_a50,peVar2,local_a80);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_a40,&local_a50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"",&local_aa9);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_a00,&local_a28,&local_a40,&local_aa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad0,"u,url-update",&local_ad1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"Update relative URLs to their new relative paths",&local_af9);
  cxxopts::value<bool>((cxxopts *)&local_b30,&local_4ad);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_b30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b50,"true",&local_b51);
  (*peVar2->_vptr_Value[10])(&local_b20,peVar2,local_b50);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_b10,&local_b20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,"",&local_b79);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_ad0,&local_af8,&local_b10,&local_b78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ba0,"remove-auto-toc",&local_ba1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,"Remove automatic table of contents",&local_bc9);
  cxxopts::value<bool>((cxxopts *)&local_c00,&local_4ae);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_c00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c20,"true",&local_c21);
  (*peVar2->_vptr_Value[10])(&local_bf0,peVar2,local_c20);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_be0,&local_bf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c48,"",&local_c49);
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_ba0,&local_bc8,&local_be0,&local_c48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"trace",&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c98,"Trace commands",&local_c99);
  cxxopts::value<bool>((cxxopts *)&local_cd0,&local_4af);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_cd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_cf0,"true",&local_cf1);
  (*peVar2->_vptr_Value[10])(&local_cc0,peVar2,local_cf0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_cb0,&local_cc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d18,"",&local_d19);
  cxxopts::OptionAdder::operator()(pOVar3,&local_c70,&local_c98,&local_cb0,(string *)local_d18);
  std::__cxx11::string::~string((string *)local_d18);
  std::allocator<char>::~allocator(&local_d19);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_cb0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_cc0);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator(&local_cf1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_cd0);
  std::__cxx11::string::~string((string *)&local_c98);
  std::allocator<char>::~allocator(&local_c99);
  std::__cxx11::string::~string((string *)&local_c70);
  std::allocator<char>::~allocator(&local_c71);
  std::__cxx11::string::~string((string *)&local_c48);
  std::allocator<char>::~allocator(&local_c49);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_be0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_bf0);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator(&local_c21);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_c00);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::allocator<char>::~allocator(&local_ba1);
  std::__cxx11::string::~string((string *)&local_b78);
  std::allocator<char>::~allocator(&local_b79);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_b10);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_b20);
  std::__cxx11::string::~string(local_b50);
  std::allocator<char>::~allocator(&local_b51);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_b30);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator(&local_ad1);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator(&local_aa9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_a40);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_a50);
  std::__cxx11::string::~string(local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_a60);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator(&local_a29);
  std::__cxx11::string::~string((string *)&local_a00);
  std::allocator<char>::~allocator(&local_a01);
  std::__cxx11::string::~string((string *)&local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_970);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_980);
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_990);
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator(&local_959);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator(&local_931);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator(&local_909);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_8a0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_8b0);
  std::__cxx11::string::~string(local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_8c0);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_7d0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_7e0);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_7f0);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_700);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_710);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_720);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_630);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_640);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator(&local_671);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_650);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_560);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_570);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_580);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator(&local_521);
  cxxopts::OptionAdder::~OptionAdder(&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  local_d1a = true;
  local_d1b = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"Help",&local_d69);
  cxxopts::Options::add_options(&local_d48,(Options *)local_138,&local_d68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d90,"h,help",&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_db8,"Print usage",&local_db9);
  cxxopts::value<bool>((cxxopts *)&local_df0,&local_d1a);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e10,"false",&local_e11);
  (*peVar2->_vptr_Value[10])(&local_de0,peVar2,local_e10);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_dd0,&local_de0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e38,"",&local_e39);
  pOVar3 = cxxopts::OptionAdder::operator()(&local_d48,&local_d90,&local_db8,&local_dd0,&local_e38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e60,"v,version",&local_e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e88,"Print version",&local_e89);
  cxxopts::value<bool>((cxxopts *)&local_ec0,&local_d1b);
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_ec0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ee0,"false",&local_ee1);
  (*peVar2->_vptr_Value[10])(&local_eb0,peVar2,local_ee0);
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            ((shared_ptr<cxxopts::Value_const> *)&local_ea0,&local_eb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f08,"",
             (allocator<char> *)
             ((long)&result.m_sequential.
                     super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cxxopts::OptionAdder::operator()(pOVar3,&local_e60,&local_e88,&local_ea0,&local_f08);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&result.m_sequential.
                     super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_ea0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_eb0);
  std::__cxx11::string::~string(local_ee0);
  std::allocator<char>::~allocator(&local_ee1);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_ec0);
  std::__cxx11::string::~string((string *)&local_e88);
  std::allocator<char>::~allocator(&local_e89);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator(&local_e61);
  std::__cxx11::string::~string((string *)&local_e38);
  std::allocator<char>::~allocator(&local_e39);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_dd0);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_de0);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator(&local_e11);
  std::shared_ptr<cxxopts::Value>::~shared_ptr(&local_df0);
  std::__cxx11::string::~string((string *)&local_db8);
  std::allocator<char>::~allocator(&local_db9);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator(&local_d91);
  cxxopts::OptionAdder::~OptionAdder(&local_d48);
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator(&local_d69);
  cxxopts::Options::parse
            ((ParseResult *)local_fd0,(Options *)local_138,(int *)&argv_local,
             (char ***)&options.m_help._M_t._M_impl.super__Rb_tree_header._M_node_count);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Please provide an input file");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  local_ff2 = 0;
  local_ff3 = 0;
  bVar7 = true;
  if ((local_d1a & 1U) == 0) {
    std::allocator<char>::allocator();
    local_ff2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ff0,"help",&local_ff1);
    local_ff3 = 1;
    sVar5 = cxxopts::ParseResult::count((ParseResult *)local_fd0,&local_ff0);
    bVar7 = sVar5 != 0;
  }
  if ((local_ff3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_ff0);
  }
  if ((local_ff2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_ff1);
  }
  if (bVar7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1018,"-i input_directory -o output_directory -r username/repository"
               ,&local_1019);
    cxxopts::Options::custom_help((Options *)local_138,&local_1018);
    std::__cxx11::string::~string((string *)&local_1018);
    std::allocator<char>::~allocator(&local_1019);
    local_10d4 = 1;
    local_10d0 = &local_10c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c8,"File",&local_10d1);
    local_10d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_10a8,"Behaviour",&local_10d2);
    local_10d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1088;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1088,"Help",&local_10d3);
    local_10d4 = 0;
    local_1068 = &local_10c8;
    local_1060 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_10d5);
    __l._M_len = local_1060;
    __l._M_array = local_1068;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1058,__l,&local_10d5);
    cxxopts::Options::help(&local_1040,(Options *)local_138,&local_1058);
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_1040);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1040);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1058);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_10d5);
    local_15a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1068;
    do {
      local_15a8 = local_15a8 + -1;
      std::__cxx11::string::~string((string *)local_15a8);
    } while (local_15a8 != &local_10c8);
    std::allocator<char>::~allocator(&local_10d3);
    std::allocator<char>::~allocator(&local_10d2);
    std::allocator<char>::~allocator(&local_10d1);
    uVar1 = std::__cxx11::string::empty();
    argv_local._4_4_ = (uint)((uVar1 & 1) != 0);
    m.sections_.super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else if ((local_d1b & 1U) == 0) {
    mdsplit::mdsplitter::mdsplitter((mdsplitter *)local_11b8);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_11e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
               auto_format);
    mdsplit::mdsplitter::input((mdsplitter *)local_11b8,&local_11e0);
    std::filesystem::__cxx11::path::~path(&local_11e0);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_1208,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
               auto_format);
    mdsplit::mdsplitter::output_dir((mdsplitter *)local_11b8,&local_1208);
    std::filesystem::__cxx11::path::~path(&local_1208);
    mdsplit::mdsplitter::repository((mdsplitter *)local_11b8,(string *)local_208);
    mdsplit::mdsplitter::max_split_level
              ((mdsplitter *)local_11b8,
               clear_html_tags.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_);
    local_1210._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&erase_old_mdsplit_files);
    local_1218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&erase_old_mdsplit_files);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_1210,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_1218);
    local_1230._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&erase_old_mdsplit_files);
    local_1238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&erase_old_mdsplit_files);
    local_1228 = std::
                 unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (local_1230,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )local_1238);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1220,&local_1228);
    local_1248._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&erase_old_mdsplit_files);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1240,&local_1248);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&erase_old_mdsplit_files,local_1220,local_1240);
    mdsplit::mdsplitter::clear_html_tags
              ((mdsplitter *)local_11b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&erase_old_mdsplit_files);
    mdsplit::mdsplitter::include_toc((mdsplitter *)local_11b8,(bool)(local_4a9 & 1));
    mdsplit::mdsplitter::jekyll_escape((mdsplitter *)local_11b8,(bool)(local_4aa & 1));
    mdsplit::mdsplitter::indent_headers((mdsplitter *)local_11b8,(bool)(local_4ab & 1));
    mdsplit::mdsplitter::add_front_matter((mdsplitter *)local_11b8,(bool)(local_4ac & 1));
    mdsplit::mdsplitter::update_links((mdsplitter *)local_11b8,(bool)(local_4ad & 1));
    mdsplit::mdsplitter::remove_autotoc((mdsplitter *)local_11b8,(bool)(local_4ae & 1));
    mdsplit::mdsplitter::trace((mdsplitter *)local_11b8,(bool)(local_4af & 1));
    mdsplit::mdsplitter::erase_old_mdsplit_files((mdsplitter *)local_11b8,(bool)(local_4b0 & 1));
    argv_local._4_4_ = mdsplit::mdsplitter::run((mdsplitter *)local_11b8);
    m.sections_.super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    mdsplit::mdsplitter::~mdsplitter((mdsplitter *)local_11b8);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"mdsplit: version 0.0.1");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
    m.sections_.super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  cxxopts::ParseResult::~ParseResult((ParseResult *)local_fd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&erase_old_mdsplit_files);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1b8);
  cxxopts::Options::~Options((Options *)local_138);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    ///////////////////////////////////////////////////////
    /// Define command line options                     ///
    ///////////////////////////////////////////////////////
    cxxopts::Options options("mdsplit",
                             "Generate documentation from README.md files");
    std::string input = "README.md";
    std::string output = "docs";
    std::string repository;
    options.add_options("File")(
        "i,input", "Input file",
        cxxopts::value(input)->default_value("README.md"))(
        "o,output", "Output directory",
        cxxopts::value(output)->default_value("docs"))(
        "r,repository", "Output repository", cxxopts::value(repository));

    short max_split_level{6};
    std::vector<std::string> clear_html_tags{};
    bool include_toc{false};
    bool jekyll_escape{true};
    bool indent_headers{true};
    bool add_front_matter{true};
    bool update_links{true};
    bool remove_autotoc{true};
    bool trace{true};
    bool erase_old_mdsplit_files{true};
    options.add_options("Behaviour")(
        "l,level", "Max level for which we should split the file",
        cxxopts::value(max_split_level)->default_value("6"))(
        "c,clear-html", "List of HTML tags mdsplit should clear",
        cxxopts::value(clear_html_tags)->default_value("details,summary"))(
        "t,toc", "Create a table of contents for the new files",
        cxxopts::value(include_toc)->default_value("false"))(
        "e,erase-old-mdsplit-files",
        "Erase old md files also generated with mdsplit",
        cxxopts::value(erase_old_mdsplit_files)->default_value("true"))(
        "j,jekyll-escape", "Escape consecutive \"{{\"s for Jekyll processing",
        cxxopts::value(jekyll_escape)->default_value("true"))(
        "header-reindent", "Reindent headers to match the new files",
        cxxopts::value(indent_headers)->default_value("true"))(
        "f,front-matter", "Include a front-matter in the new files",
        cxxopts::value(add_front_matter)->default_value("true"))(
        "u,url-update", "Update relative URLs to their new relative paths",
        cxxopts::value(update_links)->default_value("true"))(
        "remove-auto-toc", "Remove automatic table of contents",
        cxxopts::value(remove_autotoc)->default_value("true"))(
        "trace", "Trace commands",
        cxxopts::value(trace)->default_value("true"));

    bool show_help{true};
    bool show_version{false};
    options.add_options("Help")(
        "h,help", "Print usage",
        cxxopts::value(show_help)->default_value("false"))(
        "v,version", "Print version",
        cxxopts::value(show_version)->default_value("false"));

    ///////////////////////////////////////////////////////
    /// Parse command line options                      ///
    ///////////////////////////////////////////////////////
    auto result = options.parse(argc, argv);

    if (input.empty()) {
        std::cerr << "Please provide an input file" << std::endl;
    }

    if (show_help || result.count("help")) {
        options.custom_help(
            "-i input_directory -o output_directory -r username/repository");
        std::cout << options.help({"File", "Behaviour", "Help"}) << std::endl;
        return input.empty() ? 1 : 0;
    }

    // Show version
    if (show_version) {
        std::cout << "mdsplit: version 0.0.1" << std::endl;
        return 0;
    }

    ///////////////////////////////////////////////////////
    /// Run                                             ///
    ///////////////////////////////////////////////////////
    mdsplit::mdsplitter m;
    m.input(input);
    m.output_dir(output);
    m.repository(repository);
    m.max_split_level(max_split_level);
    std::sort(clear_html_tags.begin(), clear_html_tags.end());
    clear_html_tags.erase(
        std::unique(clear_html_tags.begin(), clear_html_tags.end()),
        clear_html_tags.end());
    m.clear_html_tags(clear_html_tags);
    m.include_toc(include_toc);
    m.jekyll_escape(jekyll_escape);
    m.indent_headers(indent_headers);
    m.add_front_matter(add_front_matter);
    m.update_links(update_links);
    m.remove_autotoc(remove_autotoc);
    m.trace(trace);
    m.erase_old_mdsplit_files(erase_old_mdsplit_files);
    return m.run();
}